

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

string_type * __thiscall
toml::detail::serializer<toml::type_config>::format_comments_abi_cxx11_
          (serializer<toml::type_config> *this,preserve_comments *comments,indent_char indent_type)

{
  bool bVar1;
  const_reference pvVar2;
  undefined8 in_RDX;
  string_type *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  const_iterator __end3;
  const_iterator __begin3;
  preserve_comments *__range3;
  string_type *retval;
  string_type *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  indent_char in_stack_ffffffffffffffb7;
  serializer<toml::type_config> *in_stack_ffffffffffffffb8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  undefined8 local_28;
  undefined1 local_1a;
  undefined8 local_18;
  
  local_1a = 0;
  this_00 = in_RDI;
  local_18 = in_RDX;
  std::__cxx11::string::string(in_stack_ffffffffffffff50);
  local_28 = local_18;
  local_30._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       preserve_comments::begin_abi_cxx11_((preserve_comments *)in_RDI);
  preserve_comments::end_abi_cxx11_((preserve_comments *)in_RDI);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)this_00,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_RDI), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(&local_30);
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6b6dba);
    if (!bVar1) {
      format_indent_abi_cxx11_(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb7);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
      std::__cxx11::string::~string(this_00);
      pvVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::front((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00)
      ;
      if (*pvVar2 != '#') {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   (char)((ulong)in_RDI >> 0x38));
      }
      std::__cxx11::string::string(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff78);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
      std::__cxx11::string::~string(this_00);
      std::__cxx11::string::~string(this_00);
      pvVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
      if (*pvVar2 != '\n') {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   (char)((ulong)in_RDI >> 0x38));
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_30);
  }
  return this_00;
}

Assistant:

string_type format_comments(const preserve_comments& comments, const indent_char indent_type) const // {{{
    {
        string_type retval;
        for(const auto& c : comments)
        {
            if(c.empty()) {continue;}
            retval += format_indent(indent_type);
            if(c.front() != '#') {retval += char_type('#');}
            retval += string_conv<string_type>(c);
            if(c.back() != '\n') {retval += char_type('\n');}
        }
        return retval;
    }